

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ExpressionRunner<wasm::CExpressionRunner>::visitStructSet
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::CExpressionRunner> *this,
          StructSet *curr)

{
  pointer pFVar1;
  Struct *pSVar2;
  Literal *pLVar3;
  shared_ptr<wasm::GCData> sVar4;
  undefined1 local_108 [8];
  Flow ref;
  Flow value;
  value_type field;
  anon_union_16_5_9943fe1e_for_Literal_0 local_50;
  undefined1 local_38 [8];
  shared_ptr<wasm::GCData> data;
  
  visit((Flow *)local_108,this,curr->ref);
  if (ref.breakTo.super_IString.str._M_len == 0) {
    visit((Flow *)&ref.breakTo.super_IString.str._M_str,this,curr->value);
    if (value.breakTo.super_IString.str._M_len == 0) {
      Flow::getSingleValue((Flow *)local_108);
      sVar4 = Literal::getGCData((Literal *)local_38);
      if (local_38 == (undefined1  [8])0x0) {
        (*this->_vptr_ExpressionRunner[2])
                  (this,"null ref",
                   sVar4.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi._M_pi);
      }
      local_50.i64 = (int64_t)wasm::Type::getHeapType(&curr->ref->type);
      pSVar2 = HeapType::getStruct((HeapType *)&local_50.func);
      pFVar1 = (pSVar2->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
               _M_impl.super__Vector_impl_data._M_start + curr->index;
      value.breakTo.super_IString.str._M_str = (char *)(pFVar1->type).id;
      field.type.id._0_4_ = pFVar1->packedType;
      field.type.id._4_4_ = pFVar1->mutable_;
      pLVar3 = Flow::getSingleValue((Flow *)&ref.breakTo.super_IString.str._M_str);
      Literal::Literal((Literal *)&field.packedType,pLVar3);
      truncateForPacking((Literal *)&local_50.func,this,(Literal *)&field.packedType,
                         (Field *)&value.breakTo.super_IString.str._M_str);
      pLVar3 = (((Literals *)((long)local_38 + 8))->super_SmallVector<wasm::Literal,_1UL>).flexible.
               super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
               super__Vector_impl_data._M_start + ((ulong)curr->index - 1);
      if ((ulong)curr->index == 0) {
        pLVar3 = (((Literals *)((long)local_38 + 8))->super_SmallVector<wasm::Literal,_1UL>).fixed.
                 _M_elems;
      }
      Literal::operator=(pLVar3,(Literal *)&local_50.func);
      Literal::~Literal((Literal *)&local_50.func);
      Literal::~Literal((Literal *)&field.packedType);
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__return_storage_ptr__->breakTo).super_IString.str._M_len = 0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
      field_0.func.super_IString.str._M_str = (char *)0x0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.
      id = 0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
      field_0.i64 = 0;
      (__return_storage_ptr__->breakTo).super_IString.str._M_str = (char *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&data);
    }
    else {
      Flow::Flow(__return_storage_ptr__,(Flow *)&ref.breakTo.super_IString.str._M_str);
    }
    SmallVector<wasm::Literal,_1UL>::~SmallVector
              ((SmallVector<wasm::Literal,_1UL> *)&ref.breakTo.super_IString.str._M_str);
  }
  else {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_108);
  }
  SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)local_108);
  return __return_storage_ptr__;
}

Assistant:

Flow visitStructSet(StructSet* curr) {
    NOTE_ENTER("StructSet");
    Flow ref = self()->visit(curr->ref);
    if (ref.breaking()) {
      return ref;
    }
    Flow value = self()->visit(curr->value);
    if (value.breaking()) {
      return value;
    }
    auto data = ref.getSingleValue().getGCData();
    if (!data) {
      trap("null ref");
    }
    auto field = curr->ref->type.getHeapType().getStruct().fields[curr->index];
    data->values[curr->index] =
      truncateForPacking(value.getSingleValue(), field);
    return Flow();
  }